

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

ITexture * __thiscall
irr::video::CNullDriver::addTextureCubemap
          (CNullDriver *this,u32 sideLen,path *name,ECOLOR_FORMAT format)

{
  bool bVar1;
  u32 uVar2;
  undefined4 extraout_var;
  u32 in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  ITexture *in_RDI;
  double __x;
  int i_1;
  ITexture *t;
  int i;
  array<irr::video::IImage_*> imageArray;
  undefined4 in_stack_ffffffffffffff78;
  u32 in_stack_ffffffffffffff7c;
  CNullDriver *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  ITexture *local_68;
  dimension2d<unsigned_int> in_stack_ffffffffffffffa0;
  CNullDriver *in_stack_ffffffffffffffa8;
  int local_4c;
  undefined1 local_48 [36];
  u32 local_24;
  undefined8 local_20;
  uint local_14 [3];
  ITexture *local_8;
  
  if (in_ESI == 0) {
    local_8 = (ITexture *)0x0;
  }
  else {
    local_24 = in_ECX;
    local_20 = in_RDX;
    uVar2 = core::string<char>::size((string<char> *)0x309c86);
    if (uVar2 == 0) {
      os::Printer::log((Printer *)
                       "Could not create ITexture, texture needs to have a non-empty name.",__x);
      local_8 = (ITexture *)0x0;
    }
    else {
      core::array<irr::video::IImage_*>::array
                ((array<irr::video::IImage_*> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
      ;
      for (local_4c = 0; local_4c < 6; local_4c = local_4c + 1) {
        in_stack_ffffffffffffff80 = (CNullDriver *)operator_new(0x50);
        in_stack_ffffffffffffff7c = local_24;
        core::dimension2d<unsigned_int>::dimension2d
                  ((dimension2d<unsigned_int> *)&stack0xffffffffffffffa0,local_14,local_14);
        CImage::CImage((CImage *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (ECOLOR_FORMAT)((ulong)in_RDI >> 0x20),
                       (dimension2d<unsigned_int> *)in_stack_ffffffffffffff80);
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff80;
        core::array<irr::video::IImage_*>::push_back
                  ((array<irr::video::IImage_*> *)in_stack_ffffffffffffff80,
                   (IImage **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      local_68 = (ITexture *)0x0;
      bVar1 = checkImage(in_stack_ffffffffffffffa8,
                         (array<irr::video::IImage_*> *)in_stack_ffffffffffffffa0);
      if (bVar1) {
        iVar3 = (*in_RDI->_vptr_ITexture[0x76])(in_RDI,local_20,local_48);
        local_68 = (ITexture *)CONCAT44(extraout_var,iVar3);
        if (local_68 != (ITexture *)0x0) {
          addTexture((CNullDriver *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_RDI);
          IReferenceCounted::drop
                    ((IReferenceCounted *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
      }
      for (iVar3 = 0; iVar3 < 6; iVar3 = iVar3 + 1) {
        core::array<irr::video::IImage_*>::operator[]
                  ((array<irr::video::IImage_*> *)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff7c);
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      local_8 = local_68;
      core::array<irr::video::IImage_*>::~array((array<irr::video::IImage_*> *)0x309de5);
    }
  }
  return local_8;
}

Assistant:

ITexture *CNullDriver::addTextureCubemap(const irr::u32 sideLen, const io::path &name, ECOLOR_FORMAT format)
{
	if (0 == sideLen)
		return 0;

	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	core::array<IImage *> imageArray(6);
	for (int i = 0; i < 6; ++i)
		imageArray.push_back(new CImage(format, core::dimension2du(sideLen, sideLen)));

	ITexture *t = 0;
	if (checkImage(imageArray)) {
		t = createDeviceDependentTextureCubemap(name, imageArray);

		if (t) {
			addTexture(t);
			t->drop();
		}
	}

	for (int i = 0; i < 6; ++i)
		imageArray[i]->drop();

	return t;
}